

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O0

void __thiscall
t_perl_generator::generate_serialize_container
          (t_perl_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  string *psVar1;
  ulong uVar2;
  t_type *ptVar3;
  ostream *poVar4;
  string local_258;
  allocator local_231;
  string local_230;
  undefined1 local_210 [8];
  string iter_1;
  allocator local_1c9;
  string local_1c8;
  undefined1 local_1a8 [8];
  string iter;
  string local_168;
  allocator local_141;
  string local_140;
  undefined1 local_120 [8];
  string viter;
  string local_f8;
  undefined1 local_d8 [8];
  string kiter;
  string local_98;
  string local_78;
  string local_48;
  string *local_28;
  string *prefix_local;
  t_type *ttype_local;
  ostream *out_local;
  t_perl_generator *this_local;
  
  local_28 = prefix;
  prefix_local = (string *)ttype;
  ttype_local = (t_type *)out;
  out_local = (ostream *)this;
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  uVar2 = (**(code **)(*(long *)prefix_local + 0x80))();
  if ((uVar2 & 1) == 0) {
    uVar2 = (**(code **)(*(long *)prefix_local + 0x78))();
    if ((uVar2 & 1) == 0) {
      uVar2 = (**(code **)(*(long *)prefix_local + 0x70))();
      if ((uVar2 & 1) != 0) {
        poVar4 = t_generator::indent((t_generator *)this,(ostream *)ttype_local);
        poVar4 = std::operator<<(poVar4,"$xfer += $output->writeListBegin(");
        ptVar3 = t_list::get_elem_type((t_list *)prefix_local);
        type_to_enum_abi_cxx11_((string *)(kiter.field_2._M_local_buf + 8),this,ptVar3);
        poVar4 = std::operator<<(poVar4,(string *)(kiter.field_2._M_local_buf + 8));
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = std::operator<<(poVar4,"scalar(@{$");
        poVar4 = std::operator<<(poVar4,(string *)prefix);
        poVar4 = std::operator<<(poVar4,"}));");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)(kiter.field_2._M_local_buf + 8));
      }
    }
    else {
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)ttype_local);
      poVar4 = std::operator<<(poVar4,"$xfer += $output->writeSetBegin(");
      ptVar3 = t_set::get_elem_type((t_set *)prefix_local);
      type_to_enum_abi_cxx11_(&local_98,this,ptVar3);
      poVar4 = std::operator<<(poVar4,(string *)&local_98);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,"scalar(@{$");
      poVar4 = std::operator<<(poVar4,(string *)prefix);
      poVar4 = std::operator<<(poVar4,"}));");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_98);
    }
  }
  else {
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)ttype_local);
    poVar4 = std::operator<<(poVar4,"$xfer += $output->writeMapBegin(");
    ptVar3 = t_map::get_key_type((t_map *)prefix_local);
    type_to_enum_abi_cxx11_(&local_48,this,ptVar3);
    poVar4 = std::operator<<(poVar4,(string *)&local_48);
    poVar4 = std::operator<<(poVar4,", ");
    ptVar3 = t_map::get_val_type((t_map *)prefix_local);
    type_to_enum_abi_cxx11_(&local_78,this,ptVar3);
    poVar4 = std::operator<<(poVar4,(string *)&local_78);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = std::operator<<(poVar4,"scalar(keys %{$");
    poVar4 = std::operator<<(poVar4,(string *)prefix);
    poVar4 = std::operator<<(poVar4,"}));");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_48);
  }
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)ttype_local);
  uVar2 = (**(code **)(*(long *)prefix_local + 0x80))();
  if ((uVar2 & 1) == 0) {
    uVar2 = (**(code **)(*(long *)prefix_local + 0x78))();
    if ((uVar2 & 1) == 0) {
      uVar2 = (**(code **)(*(long *)prefix_local + 0x70))();
      if ((uVar2 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_230,"iter",&local_231);
        t_generator::tmp((string *)local_210,(t_generator *)this,&local_230);
        std::__cxx11::string::~string((string *)&local_230);
        std::allocator<char>::~allocator((allocator<char> *)&local_231);
        poVar4 = t_generator::indent((t_generator *)this,(ostream *)ttype_local);
        poVar4 = std::operator<<(poVar4,"foreach my $");
        poVar4 = std::operator<<(poVar4,(string *)local_210);
        poVar4 = std::operator<<(poVar4," (@{$");
        poVar4 = std::operator<<(poVar4,(string *)prefix);
        poVar4 = std::operator<<(poVar4,"}) ");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)ttype_local);
        ptVar3 = ttype_local;
        psVar1 = prefix_local;
        std::__cxx11::string::string((string *)&local_258,(string *)local_210);
        generate_serialize_list_element(this,(ostream *)ptVar3,(t_list *)psVar1,&local_258);
        std::__cxx11::string::~string((string *)&local_258);
        t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)ttype_local);
        std::__cxx11::string::~string((string *)local_210);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1c8,"iter",&local_1c9);
      t_generator::tmp((string *)local_1a8,(t_generator *)this,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)ttype_local);
      poVar4 = std::operator<<(poVar4,"foreach my $");
      poVar4 = std::operator<<(poVar4,(string *)local_1a8);
      poVar4 = std::operator<<(poVar4," (@{$");
      poVar4 = std::operator<<(poVar4,(string *)prefix);
      poVar4 = std::operator<<(poVar4,"})");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)ttype_local);
      ptVar3 = ttype_local;
      psVar1 = prefix_local;
      std::__cxx11::string::string((string *)(iter_1.field_2._M_local_buf + 8),(string *)local_1a8);
      generate_serialize_set_element
                (this,(ostream *)ptVar3,(t_set *)psVar1,(string *)((long)&iter_1.field_2 + 8));
      std::__cxx11::string::~string((string *)(iter_1.field_2._M_local_buf + 8));
      t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)ttype_local);
      std::__cxx11::string::~string((string *)local_1a8);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_f8,"kiter",(allocator *)(viter.field_2._M_local_buf + 0xf));
    t_generator::tmp((string *)local_d8,(t_generator *)this,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)(viter.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_140,"viter",&local_141);
    t_generator::tmp((string *)local_120,(t_generator *)this,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)ttype_local);
    poVar4 = std::operator<<(poVar4,"while( my ($");
    poVar4 = std::operator<<(poVar4,(string *)local_d8);
    poVar4 = std::operator<<(poVar4,",$");
    poVar4 = std::operator<<(poVar4,(string *)local_120);
    poVar4 = std::operator<<(poVar4,") = each %{$");
    poVar4 = std::operator<<(poVar4,(string *)prefix);
    poVar4 = std::operator<<(poVar4,"}) ");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)ttype_local);
    ptVar3 = ttype_local;
    psVar1 = prefix_local;
    std::__cxx11::string::string((string *)&local_168,(string *)local_d8);
    std::__cxx11::string::string((string *)(iter.field_2._M_local_buf + 8),(string *)local_120);
    generate_serialize_map_element
              (this,(ostream *)ptVar3,(t_map *)psVar1,&local_168,(string *)((long)&iter.field_2 + 8)
              );
    std::__cxx11::string::~string((string *)(iter.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_168);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)ttype_local);
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::string::~string((string *)local_d8);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)ttype_local);
  uVar2 = (**(code **)(*(long *)prefix_local + 0x80))();
  if ((uVar2 & 1) == 0) {
    uVar2 = (**(code **)(*(long *)prefix_local + 0x78))();
    if ((uVar2 & 1) == 0) {
      uVar2 = (**(code **)(*(long *)prefix_local + 0x70))();
      if ((uVar2 & 1) != 0) {
        poVar4 = t_generator::indent((t_generator *)this,(ostream *)ttype_local);
        poVar4 = std::operator<<(poVar4,"$xfer += $output->writeListEnd();");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      }
    }
    else {
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)ttype_local);
      poVar4 = std::operator<<(poVar4,"$xfer += $output->writeSetEnd();");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
  }
  else {
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)ttype_local);
    poVar4 = std::operator<<(poVar4,"$xfer += $output->writeMapEnd();");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)ttype_local);
  return;
}

Assistant:

void t_perl_generator::generate_serialize_container(ostream& out, t_type* ttype, string prefix) {
  scope_up(out);

  if (ttype->is_map()) {
    indent(out) << "$xfer += $output->writeMapBegin("
                << type_to_enum(((t_map*)ttype)->get_key_type()) << ", "
                << type_to_enum(((t_map*)ttype)->get_val_type()) << ", "
                << "scalar(keys %{$" << prefix << "}));" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "$xfer += $output->writeSetBegin("
                << type_to_enum(((t_set*)ttype)->get_elem_type()) << ", "
                << "scalar(@{$" << prefix << "}));" << endl;

  } else if (ttype->is_list()) {

    indent(out) << "$xfer += $output->writeListBegin("
                << type_to_enum(((t_list*)ttype)->get_elem_type()) << ", "
                << "scalar(@{$" << prefix << "}));" << endl;
  }

  scope_up(out);

  if (ttype->is_map()) {
    string kiter = tmp("kiter");
    string viter = tmp("viter");
    indent(out) << "while( my ($" << kiter << ",$" << viter << ") = each %{$" << prefix << "}) "
                << endl;

    scope_up(out);
    generate_serialize_map_element(out, (t_map*)ttype, kiter, viter);
    scope_down(out);

  } else if (ttype->is_set()) {
    string iter = tmp("iter");
    indent(out) << "foreach my $" << iter << " (@{$" << prefix << "})" << endl;
    scope_up(out);
    generate_serialize_set_element(out, (t_set*)ttype, iter);
    scope_down(out);

  } else if (ttype->is_list()) {
    string iter = tmp("iter");
    indent(out) << "foreach my $" << iter << " (@{$" << prefix << "}) " << endl;
    scope_up(out);
    generate_serialize_list_element(out, (t_list*)ttype, iter);
    scope_down(out);
  }

  scope_down(out);

  if (ttype->is_map()) {
    indent(out) << "$xfer += $output->writeMapEnd();" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "$xfer += $output->writeSetEnd();" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "$xfer += $output->writeListEnd();" << endl;
  }

  scope_down(out);
}